

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *
pybind11::detail::all_type_info(PyTypeObject *type)

{
  PyTypeObject *unaff_R14;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar1;
  
  pVar1 = all_type_info_get_cache(unaff_R14);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (type,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                     *)((long)pVar1.first.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                       + 0x10));
  }
  return (vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *)
         ((long)pVar1.first.
                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
         + 0x10);
}

Assistant:

inline const std::vector<detail::type_info *> &all_type_info(PyTypeObject *type) {
    auto ins = all_type_info_get_cache(type);
    if (ins.second)
        // New cache entry: populate it
        all_type_info_populate(type, ins.first->second);

    return ins.first->second;
}